

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gs.c
# Opt level: O2

int32 gs_display(char *file,gs_t *gs)

{
  uint uVar1;
  gs_t *gs_00;
  FILE *pFVar2;
  bitvec_t *val;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  float32 fVar8;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,100,"Reading gaussian selector map: %s\n",file);
  gs_00 = (gs_t *)__ckd_calloc__(1,0x40,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
                                 ,0x65);
  pFVar2 = fopen(file,"rb");
  gs_00->fp = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_mgau = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x6c,"The number of mixtures of gaussian: %d\n",(ulong)uVar1);
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_feat = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x6e,"The number of features stream: %d\n",(ulong)uVar1);
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_density = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x70,"The number of density: %d\n",(ulong)uVar1);
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_code = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x72,"The number of code word: %d\n",(ulong)uVar1);
    uVar1 = gs_fread_int32(gs_00);
    gs_00->n_featlen = uVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x74,"The feature length: %d\n",(ulong)uVar1);
    gs_00->n_mbyte = ((gs_00->n_density + 0x1f) / 0x20) * 4;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
            ,0x76,"The number of byte to read: %d\n");
    val = (bitvec_t *)
          __ckd_calloc__((long)((gs_00->n_density + 0x1f) / 0x20),4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
                         ,0x79);
    for (iVar5 = 0; iVar5 < gs_00->n_code; iVar5 = iVar5 + 1) {
      printf("Code idx: %d\n");
      for (iVar3 = 0; iVar3 < gs_00->n_featlen; iVar3 = iVar3 + 1) {
        fVar8 = gs_fread_float32(gs_00);
        printf("%f ",(double)(float)fVar8);
      }
      putchar(10);
      for (uVar1 = 0; (int)uVar1 < gs_00->n_mgau; uVar1 = uVar1 + 1) {
        for (uVar4 = 0; (int)uVar4 < gs_00->n_feat; uVar4 = (ulong)((int)uVar4 + 1)) {
          gs_fread_bitvec_t(val,gs_00);
          printf("%d %d ",(ulong)uVar1,uVar4);
          uVar7 = 0;
          while (uVar6 = (uint)uVar7, (int)uVar6 < gs_00->n_density) {
            if ((val[uVar7 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
              printf("%d ",uVar7);
            }
            uVar7 = (ulong)(uVar6 + 1);
          }
          putchar(10);
        }
      }
    }
    putchar(10);
    gs_free(gs_00);
    return 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/gs.c"
          ,0x68,"fopen(%s,rb) failed\n",file);
  exit(1);
}

Assistant:

int
gs_display(char *file, gs_t * gs)
{
    int32 i;
    int32 code_id;
    int32 m_id, s_id, c_id;
    float32 tmp;
    bitvec_t *bv;

    E_INFO("Reading gaussian selector map: %s\n", file);
    gs = (gs_t *) ckd_calloc(1, sizeof(gs_t));

    if ((gs->fp = fopen(file, "rb")) == NULL)
        E_FATAL("fopen(%s,rb) failed\n", file);

    gs->n_mgau = gs_fread_int32(gs);

    E_INFO("The number of mixtures of gaussian: %d\n", gs->n_mgau);
    gs->n_feat = gs_fread_int32(gs);
    E_INFO("The number of features stream: %d\n", gs->n_feat);
    gs->n_density = gs_fread_int32(gs);
    E_INFO("The number of density: %d\n", gs->n_density);
    gs->n_code = gs_fread_int32(gs);
    E_INFO("The number of code word: %d\n", gs->n_code);
    gs->n_featlen = gs_fread_int32(gs);
    E_INFO("The feature length: %d\n", gs->n_featlen);
    gs->n_mbyte = bitvec_size(gs->n_density) * sizeof(bitvec_t);
    E_INFO("The number of byte to read: %d\n", gs->n_mbyte);

    /* allocate the bit vector here */
    bv = bitvec_alloc(gs->n_density);

    /*  for(i=0;i<gs->n_code;i++) */
    for (code_id = 0; code_id < gs->n_code; code_id++) {
        printf("Code idx: %d\n", code_id);
        for (c_id = 0; c_id < gs->n_featlen; c_id++) {
            tmp = gs_fread_float32(gs);
            printf("%f ", tmp);
        }
        printf("\n");
        for (m_id = 0; m_id < gs->n_mgau; m_id++) {
            for (s_id = 0; s_id < gs->n_feat; s_id++) {
                /*The writer currently doesn't support the byte order */
                gs_fread_bitvec_t(bv, gs);
                printf("%d %d ", m_id, s_id);

                for (i = 0; i < gs->n_density; i++) {
                    if (bitvec_is_set(bv, i)) {
                        printf("%d ", i);
                    }
                }
                printf("\n");
            }
        }
    }

    printf("\n");
    /*  bitvec_free(bv); */
    /* destroy the bit vector here */

    gs_free(gs);
    return 1;
}